

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_snap.c
# Opt level: O1

BCIns * lj_snap_restore(jit_State *J,void *exptr)

{
  byte *pbVar1;
  TValue *o;
  IRIns *pIVar2;
  ushort uVar3;
  ushort uVar4;
  uint uVar5;
  CTypeID id;
  SnapShot *pSVar6;
  SnapEntry *pSVar7;
  lua_State *plVar8;
  IRIns *pIVar9;
  IRIns *pIVar10;
  IRIns *pIVar11;
  CTInfo info;
  uint uVar12;
  undefined4 uVar13;
  SnapShot *pSVar14;
  GCcdata *pGVar15;
  byte bVar16;
  uint uVar17;
  ulong uVar18;
  IRIns *pIVar19;
  IRIns *pIVar20;
  uint8_t *puVar21;
  ExitState *ex;
  jit_State *J_00;
  BloomFilter rfilt;
  uint ref;
  IRRef2 IVar22;
  ulong uVar23;
  IRIns *pIVar24;
  uint32_t uVar25;
  CTState *cts;
  ulong uVar26;
  bool bVar27;
  CTSize sz;
  TValue *in_stack_ffffffffffffff38;
  CTSize in_stack_ffffffffffffff40;
  TValue *local_a0;
  CTSize local_7c;
  lua_State *local_78;
  GCtab *local_70;
  uint32_t local_64;
  SnapShot *local_60;
  long local_58;
  uint32_t *local_50;
  TValue local_48;
  BCIns *local_40;
  IRIns *local_38;
  
  uVar5 = J->exitno;
  ex = (ExitState *)(ulong)uVar5;
  J_00 = (jit_State *)(ulong)J->trace[J->parent].gcptr32;
  pSVar6 = (J_00->cur).snap;
  local_58 = (long)ex * 3;
  local_60 = pSVar6 + (long)ex;
  uVar23 = (ulong)local_60->nent;
  pSVar7 = (J_00->cur).snapmap;
  uVar17 = local_60->mapofs;
  pSVar14 = (SnapShot *)&(J_00->cur).nsnapmap;
  if (pSVar6 + (long)((long)ex->fpr + 1) != pSVar6 + (J_00->cur).nsnap) {
    pSVar14 = pSVar6 + (long)((long)ex->fpr + 1);
  }
  pIVar19 = (J_00->cur).ir;
  uVar26 = (ulong)((J_00->cur).nins - 1);
  if (*(char *)((long)pIVar19 + uVar26 * 8 + 5) == '\x14') {
    pIVar19 = pIVar19 + uVar26;
    rfilt = 0;
    do {
      if ((pIVar19->field_0).op2 <= uVar5) {
        rfilt = rfilt | 1L << ((ulong)*(byte *)pIVar19 & 0x3f);
      }
      pbVar1 = (byte *)((long)pIVar19 + -3);
      pIVar19 = pIVar19 + -1;
    } while (*pbVar1 == 0x14);
  }
  else {
    rfilt = 0;
  }
  uVar25 = pSVar14->mapofs;
  local_40 = (BCIns *)(ulong)pSVar7[uVar17 + uVar23];
  plVar8 = J->L;
  *(SnapEntry *)(((ulong)plVar8->cframe & 0xfffffffffffffffc) + 0x1c) = pSVar7[uVar17 + uVar23] + 4;
  if ((TValue *)(ulong)(plVar8->maxstack).ptr32 <= plVar8->base + local_60->topslot) {
    lj_snap_restore_cold_1();
  }
  local_a0 = plVar8->base + -1;
  local_78 = plVar8;
  if (uVar23 != 0) {
    local_50 = pSVar7 + (uVar25 - 1);
    local_64 = *(uint32_t *)((long)plVar8->base + -4);
    uVar26 = 0;
    do {
      uVar12 = pSVar7[uVar17 + uVar26];
      pIVar19 = local_38;
      if ((uVar12 >> 0x12 & 1) == 0) {
        o = local_a0 + (uVar12 >> 0x18);
        ref = uVar12 & 0xffff;
        pIVar9 = (J_00->cur).ir;
        if (*(char *)((long)pIVar9 + (ulong)ref * 8 + 6) == -3) {
          if (uVar26 != 0) {
            uVar18 = 0;
            do {
              if ((pSVar7[uVar17 + uVar18] & 0xffff) == ref) {
                *o = local_a0[pSVar7[uVar17 + uVar18] >> 0x18];
                goto LAB_00153f3e;
              }
              uVar18 = uVar18 + 1;
            } while (uVar26 != uVar18);
          }
          pIVar2 = pIVar9 + ref;
          if ((pIVar2->field_1).o - 0x51 < 2) {
            cts = (CTState *)(ulong)*(uint *)((ulong)(J->L->glref).ptr32 + 0x194);
            cts->L = J->L;
            id = pIVar9[(pIVar2->field_0).op1].field_1.op12;
            info = lj_ctype_info(cts,id,&local_7c);
            pGVar15 = lj_cdata_newx(cts,id,local_7c,info);
            uVar25 = (uint32_t)pGVar15;
            (o->u32).lo = uVar25;
            (o->field_2).it = 0xfffffff5;
            if ((pIVar2->field_1).o == 'R') {
              in_stack_ffffffffffffff38 =
                   (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),local_7c);
              snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,(ulong)(pIVar2->field_0).op2,
                               uVar25 + 8,in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
              pIVar19 = local_38;
            }
            else {
              uVar3 = (&((J_00->cur).snap)->ref)[local_58 * 2];
              pIVar9 = (J_00->cur).ir;
              pIVar24 = pIVar2;
LAB_00153c65:
              pIVar11 = pIVar24;
              pIVar24 = pIVar11 + 1;
              pIVar19 = local_38;
              if (pIVar24 < pIVar9 + uVar3) {
                if (*(char *)((long)pIVar11 + 0xe) == -2) {
                  if ((ulong)*(byte *)((long)pIVar11 + 0xf) == 0xff) {
                    uVar12 = *(byte *)((long)pIVar11 + 0xd) - 0x48;
                    if ((4 < uVar12) || (uVar12 == 2)) goto LAB_00153c65;
                    pIVar20 = (J_00->cur).ir;
                    pIVar19 = pIVar20 + (pIVar24->field_0).op1;
                    if (((pIVar19->field_1).o & 0xfe) == 0x38) {
                      pIVar19 = pIVar20 + (pIVar19->field_0).op1;
                    }
                    bVar27 = pIVar20 + (pIVar19->field_0).op1 == pIVar2;
                  }
                  else {
                    bVar27 = pIVar24 == pIVar2 + *(byte *)((long)pIVar11 + 0xf);
                  }
                  if (bVar27) {
                    uVar13 = 8;
                    if ((0x604208U >> (*(uint *)((long)pIVar11 + 0xc) & 0x1f) & 1) == 0) {
                      bVar16 = ((byte)*(uint *)((long)pIVar11 + 0xc) & 0x1f) - 0xf;
                      uVar13 = 4;
                      if (bVar16 < 4) {
                        uVar13 = *(undefined4 *)(&DAT_00162990 + (ulong)bVar16 * 4);
                      }
                    }
                    pIVar19 = (J_00->cur).ir;
                    uVar18 = (ulong)*(ushort *)
                                     ((long)pIVar19 + (ulong)(pIVar24->field_0).op1 * 8 + 2);
                    if (*(char *)((long)pIVar19 + uVar18 * 8 + 5) == '\x1d') {
                      IVar22 = pIVar19[uVar18 + 1].i;
                    }
                    else {
                      IVar22 = pIVar19[uVar18].field_1.op12;
                    }
                    in_stack_ffffffffffffff38 =
                         (TValue *)CONCAT44((int)((ulong)in_stack_ffffffffffffff38 >> 0x20),uVar13);
                    snap_restoredata(J_00,(GCtrace *)exptr,ex,(SnapNo)rfilt,
                                     (ulong)*(ushort *)((long)pIVar11 + 10),IVar22 + uVar25,
                                     in_stack_ffffffffffffff38,in_stack_ffffffffffffff40);
                  }
                }
                goto LAB_00153c65;
              }
            }
          }
          else {
            if ((pIVar2->field_1).o == 0x4f) {
              local_70 = lj_tab_new(J->L,(uint)(pIVar2->field_0).op1,(uint)(pIVar2->field_0).op2);
            }
            else {
              local_70 = lj_tab_dup(J->L,(GCtab *)(ulong)pIVar9[(pIVar2->field_0).op1].field_1.op12)
              ;
            }
            (o->u32).lo = (uint32_t)local_70;
            (o->field_2).it = 0xfffffff4;
            uVar3 = (&((J_00->cur).snap)->ref)[local_58 * 2];
            pIVar9 = (J_00->cur).ir;
            pIVar24 = pIVar2;
            pIVar11 = pIVar2;
            pIVar19 = local_38;
joined_r0x00153daa:
            local_38 = pIVar11;
            pIVar2 = pIVar2 + 1;
            if (pIVar2 < pIVar9 + uVar3) {
              pIVar11 = local_38;
              pIVar19 = local_38;
              if ((pIVar2->field_1).r == 0xfe) {
                if ((ulong)(pIVar2->field_1).s == 0xff) {
                  uVar12 = (pIVar2->field_1).o - 0x48;
                  if ((4 < uVar12) || (uVar12 == 2)) goto joined_r0x00153daa;
                  pIVar10 = (J_00->cur).ir;
                  pIVar20 = pIVar10 + (pIVar2->field_0).op1;
                  if (((pIVar20->field_1).o & 0xfe) == 0x38) {
                    pIVar20 = pIVar10 + (pIVar20->field_0).op1;
                  }
                  bVar27 = pIVar10 + (pIVar20->field_0).op1 == pIVar24;
                }
                else {
                  bVar27 = pIVar2 == pIVar24 + (pIVar2->field_1).s;
                }
                if (bVar27) {
                  pIVar20 = (J_00->cur).ir;
                  uVar4 = *(ushort *)((long)pIVar20 + (ulong)(pIVar2->field_0).op1 * 8 + 2);
                  if (*(char *)((long)pIVar20 + (ulong)(pIVar2->field_0).op1 * 8 + 5) == '>') {
                    if (uVar4 == 5) {
                      if (*(char *)((long)pIVar20 + (ulong)(pIVar2->field_0).op2 * 8 + 5) == '\x1b')
                      {
                        (local_70->metatable).gcptr32 = 0;
                      }
                      else {
                        in_stack_ffffffffffffff38 = &local_48;
                        snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,
                                        (uint)(pIVar2->field_0).op2,in_stack_ffffffffffffff38);
                        (local_70->metatable).gcptr32 = (uint32_t)local_48.field_2.field_0;
                        pIVar11 = local_38;
                        pIVar19 = local_38;
                      }
                    }
                  }
                  else {
                    pIVar19 = pIVar20 + uVar4;
                    if ((pIVar19->field_1).o == '\x1e') {
                      pIVar19 = pIVar20 + (pIVar19->field_0).op1;
                    }
                    lj_ir_kvalue(J->L,&local_48,pIVar19);
                    in_stack_ffffffffffffff38 = lj_tab_set(J->L,local_70,&local_48);
                    snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,
                                    (uint)(pIVar2->field_0).op2,in_stack_ffffffffffffff38);
                    pIVar24 = local_38;
                    pIVar11 = local_38;
                    pIVar19 = local_38;
                  }
                }
              }
              goto joined_r0x00153daa;
            }
          }
        }
        else {
          in_stack_ffffffffffffff38 = o;
          snap_restoreval(J,(GCtrace *)J_00,(ExitState *)exptr,uVar5,rfilt,ref,o);
          pIVar19 = local_38;
          if ((uVar12 & 0x30000) != 0) {
            uVar25 = local_64;
            if (0xffffff < uVar12) {
              uVar25 = *local_50;
              local_50 = local_50 + -1;
            }
            (o->field_2).it = uVar25;
            local_78->base = o + 1;
          }
        }
      }
LAB_00153f3e:
      local_38 = pIVar19;
      uVar26 = uVar26 + 1;
    } while (uVar26 != uVar23);
  }
  uVar17 = (byte)*local_40 - 0x3f;
  uVar5 = uVar17 >> 1;
  if ((((uVar5 | (uint)((uVar17 & 1) != 0) << 0x1f) < 6) && ((0x27U >> (uVar5 & 0x1f) & 1) != 0)) ||
     (0x58 < (byte)*local_40)) {
    puVar21 = &local_60->nslots;
  }
  else {
    local_a0 = local_78->base;
    puVar21 = (uint8_t *)((ulong)*(uint *)((ulong)local_a0[-1].u32.lo + 0x10) - 0x39);
  }
  local_78->top = local_a0 + *puVar21;
  J->nsnaprestore = J->nsnaprestore + 1;
  return local_40;
}

Assistant:

const BCIns *lj_snap_restore(jit_State *J, void *exptr)
{
  ExitState *ex = (ExitState *)exptr;
  SnapNo snapno = J->exitno;  /* For now, snapno == exitno. */
  GCtrace *T = traceref(J, J->parent);
  SnapShot *snap = &T->snap[snapno];
  MSize n, nent = snap->nent;
  SnapEntry *map = &T->snapmap[snap->mapofs];
#if !LJ_FR2 || defined(LUA_USE_ASSERT)
  SnapEntry *flinks = &T->snapmap[snap_nextofs(T, snap)-1-LJ_FR2];
#endif
#if !LJ_FR2
  ptrdiff_t ftsz0;
#endif
  TValue *frame;
  BloomFilter rfilt = snap_renamefilter(T, snapno);
  const BCIns *pc = snap_pc(&map[nent]);
  lua_State *L = J->L;

  /* Set interpreter PC to the next PC to get correct error messages. */
  setcframe_pc(cframe_raw(L->cframe), pc+1);

  /* Make sure the stack is big enough for the slots from the snapshot. */
  if (LJ_UNLIKELY(L->base + snap->topslot >= tvref(L->maxstack))) {
    L->top = curr_topL(L);
    lj_state_growstack(L, snap->topslot - curr_proto(L)->framesize);
  }

  /* Fill stack slots with data from the registers and spill slots. */
  frame = L->base-1-LJ_FR2;
#if !LJ_FR2
  ftsz0 = frame_ftsz(frame);  /* Preserve link to previous frame in slot #0. */
#endif
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    if (!(sn & SNAP_NORESTORE)) {
      TValue *o = &frame[snap_slot(sn)];
      IRRef ref = snap_ref(sn);
      IRIns *ir = &T->ir[ref];
      if (ir->r == RID_SUNK) {
	MSize j;
	for (j = 0; j < n; j++)
	  if (snap_ref(map[j]) == ref) {  /* De-duplicate sunk allocations. */
	    copyTV(L, o, &frame[snap_slot(map[j])]);
	    goto dupslot;
	  }
	snap_unsink(J, T, ex, snapno, rfilt, ir, o);
      dupslot:
	continue;
      }
      snap_restoreval(J, T, ex, snapno, rfilt, ref, o);
      if (LJ_SOFTFP32 && (sn & SNAP_SOFTFPNUM) && tvisint(o)) {
	TValue tmp;
	snap_restoreval(J, T, ex, snapno, rfilt, ref+1, &tmp);
	o->u32.hi = tmp.u32.lo;
#if !LJ_FR2
      } else if ((sn & (SNAP_CONT|SNAP_FRAME))) {
	/* Overwrite tag with frame link. */
	setframe_ftsz(o, snap_slot(sn) != 0 ? (int32_t)*flinks-- : ftsz0);
	L->base = o+1;
#endif
      }
    }
  }
#if LJ_FR2
  L->base += (map[nent+LJ_BE] & 0xff);
#endif
  lj_assertJ(map + nent == flinks, "inconsistent frames in snapshot");

  /* Compute current stack top. */
  switch (bc_op(*pc)) {
  default:
    if (bc_op(*pc) < BC_FUNCF) {
      L->top = curr_topL(L);
      break;
    }
    /* fallthrough */
  case BC_CALLM: case BC_CALLMT: case BC_RETM: case BC_TSETM:
    L->top = frame + snap->nslots;
    break;
  }
  J->nsnaprestore++;
  return pc;
}